

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<3ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>,std::tr1::tuple<int,char_const*,__locale_struct*,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<int,_const_char_*,___locale_struct_*,_void,_void,_void,_void,_void,_void,_void>
               *values,ostream *os)

{
  bool bVar1;
  ostream *this;
  StringMatchResultListener *this_00;
  tuple<int,_const_char_*,___locale_struct_*,_void,_void,_void,_void,_void,_void,_void> *in_RDX;
  tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
  *in_RSI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  __locale_struct *in_stack_fffffffffffffdd8;
  StringMatchResultListener *in_stack_fffffffffffffde0;
  StringMatchResultListener *in_stack_fffffffffffffe00;
  ostream *in_stack_ffffffffffffffe0;
  
  TuplePrefix<2ul>::
  ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>,std::tr1::tuple<int,char_const*,__locale_struct*,void,void,void,void,void,void,void>>
            (in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  std::tr1::
  get<2,testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>
            ((tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
              *)0x13b599);
  Matcher<__locale_struct_*>::Matcher
            ((Matcher<__locale_struct_*> *)in_stack_fffffffffffffde0,
             (Matcher<__locale_struct_*> *)in_stack_fffffffffffffdd8);
  std::tr1::get<2,int,char_const*,__locale_struct*,void,void,void,void,void,void,void>
            ((tuple<int,_const_char_*,___locale_struct_*,_void,_void,_void,_void,_void,_void,_void>
              *)0x13b5b6);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffe00);
  bVar1 = MatcherBase<__locale_struct_*>::MatchAndExplain
                    ((MatcherBase<__locale_struct_*> *)in_stack_fffffffffffffde0,
                     in_stack_fffffffffffffdd8,(MatchResultListener *)0x13b5f3);
  if (!bVar1) {
    this = std::operator<<((ostream *)in_RDX,"  Expected arg #");
    in_stack_fffffffffffffde0 = (StringMatchResultListener *)std::ostream::operator<<(this,2);
    std::operator<<((ostream *)in_stack_fffffffffffffde0,": ");
    this_00 = (StringMatchResultListener *)
              std::tr1::
              get<2,testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>
                        ((tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
                          *)0x13b658);
    MatcherBase<__locale_struct_*>::DescribeTo
              ((MatcherBase<__locale_struct_*> *)in_stack_fffffffffffffde0,(ostream *)this_00);
    std::operator<<((ostream *)in_RDX,"\n           Actual: ");
    UniversalPrint<__locale_struct*>
              ((__locale_struct **)in_stack_fffffffffffffde0,(ostream *)this_00);
    StringMatchResultListener::str_abi_cxx11_(this_00);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffde0,(ostream *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
    std::operator<<((ostream *)in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffde0);
  Matcher<__locale_struct_*>::~Matcher((Matcher<__locale_struct_*> *)0x13b748);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }